

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O1

bool __thiscall wasm::anon_unknown_23::Heap2Local::canHandleAsLocals(Heap2Local *this,Type type)

{
  pointer pFVar1;
  bool bVar2;
  HeapTypeKind HVar3;
  Struct *pSVar4;
  pointer pFVar5;
  bool bVar6;
  Type local_40 [2];
  Type local_30;
  Type type_local;
  HeapType heapType;
  
  if (this == (Heap2Local *)0x1) {
    bVar6 = false;
  }
  else {
    local_30.id = (uintptr_t)this;
    type_local.id = (uintptr_t)wasm::Type::getHeapType(&local_30);
    HVar3 = HeapType::getKind((HeapType *)&type_local);
    if (HVar3 == Struct) {
      pSVar4 = HeapType::getStruct((HeapType *)&type_local);
      pFVar5 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pFVar1 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar6 = pFVar5 == pFVar1;
      if ((!bVar6) && (bVar2 = TypeUpdating::canHandleAsLocal((Type)(pFVar5->type).id), bVar2)) {
        do {
          pFVar5 = pFVar5 + 1;
          bVar6 = pFVar5 == pFVar1;
          if (bVar6) {
            return bVar6;
          }
          bVar2 = TypeUpdating::canHandleAsLocal((Type)(pFVar5->type).id);
        } while (bVar2);
      }
    }
    else {
      HVar3 = HeapType::getKind((HeapType *)&type_local);
      if (HVar3 != Array) {
        __assert_fail("heapType.isArray()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                      ,0x581,"bool wasm::(anonymous namespace)::Heap2Local::canHandleAsLocals(Type)"
                     );
      }
      HeapType::getArray((HeapType *)local_40);
      bVar6 = TypeUpdating::canHandleAsLocal(local_40[0]);
    }
  }
  return bVar6;
}

Assistant:

bool canHandleAsLocals(Type type) {
    if (type == Type::unreachable) {
      return false;
    }

    auto heapType = type.getHeapType();
    if (heapType.isStruct()) {
      auto& fields = heapType.getStruct().fields;
      for (auto field : fields) {
        if (!canHandleAsLocal(field)) {
          return false;
        }
      }
      return true;
    }

    assert(heapType.isArray());
    return canHandleAsLocal(heapType.getArray().element);
  }